

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RefillIndex(Parse *pParse,Index *pIndex,int memRootPage)

{
  long lVar1;
  ushort uVar2;
  int code;
  int iVar3;
  uint iCur;
  int iReg;
  Vdbe *p;
  KeyInfo *p_00;
  int in_EDX;
  long in_RSI;
  Parse *in_RDI;
  long in_FS_OFFSET;
  int j2;
  int iDb;
  sqlite3 *db;
  int regRecord;
  KeyInfo *pKey;
  Vdbe *v;
  Pgno tnum;
  int addr2;
  int addr1;
  int iSorter;
  int iIdx;
  int iTab;
  Table *pTab;
  int iPartIdxLabel;
  Parse *in_stack_ffffffffffffff68;
  undefined4 uVar6;
  char *pcVar4;
  undefined8 uVar5;
  int in_stack_ffffffffffffff70;
  int p3;
  int in_stack_ffffffffffffff74;
  Pgno in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Parse *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int iDb_00;
  undefined4 in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  sqlite3 *db_00;
  undefined4 in_stack_ffffffffffffffa0;
  Vdbe *p_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->nTab = in_RDI->nTab + 1;
  in_RDI->nTab = in_RDI->nTab + 1;
  db_00 = in_RDI->db;
  code = sqlite3SchemaToIndex(db_00,*(Schema **)(in_RSI + 0x30));
  iVar3 = sqlite3AuthCheck((Parse *)db_00,code,
                           (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           (char *)in_stack_ffffffffffffff80,
                           (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (iVar3 == 0) {
    sqlite3TableLock(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                     (u8)((uint)in_stack_ffffffffffffff74 >> 0x18),(char *)in_stack_ffffffffffffff68
                    );
    p = sqlite3GetVdbe(in_stack_ffffffffffffff68);
    uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    if (p != (Vdbe *)0x0) {
      iVar3 = in_EDX;
      if (in_EDX < 0) {
        iVar3 = *(int *)(in_RSI + 0x58);
      }
      p_00 = sqlite3KeyInfoOfIndex((Parse *)db_00,(Index *)CONCAT44(code,in_stack_ffffffffffffff90))
      ;
      iDb_00 = in_RDI->nTab;
      in_RDI->nTab = iDb_00 + 1;
      iCur = (uint)*(ushort *)(in_RSI + 0x5e);
      p_01 = p;
      sqlite3KeyInfoRef(p_00);
      pcVar4 = (char *)CONCAT44(uVar6,0xfffffff8);
      sqlite3VdbeAddOp4(p,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                        in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,pcVar4,
                        in_stack_ffffffffffffff90);
      sqlite3OpenTable((Parse *)CONCAT44(code,in_stack_ffffffffffffff90),iCur,iDb_00,(Table *)p,
                       in_stack_ffffffffffffff7c);
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (int)((ulong)pcVar4 >> 0x20),(int)pcVar4,0);
      iReg = sqlite3GetTempReg(in_RDI);
      sqlite3MultiWrite(in_RDI);
      uVar5 = 0;
      p3 = 0;
      sqlite3GenerateIndexKey
                ((Parse *)CONCAT44(iReg,in_stack_ffffffffffffffa0),(Index *)db_00,code,
                 in_stack_ffffffffffffff90,iCur,(int *)p,(Index *)p_01,iVar3);
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,p3),(int)((ulong)uVar5 >> 0x20),
                        (int)uVar5,0);
      sqlite3ResolvePartIdxLabel
                ((Parse *)CONCAT44(in_stack_ffffffffffffff74,p3),(int)((ulong)uVar5 >> 0x20));
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,p3),(int)((ulong)uVar5 >> 0x20),
                        (int)uVar5,0);
      sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,p3),(int)((ulong)uVar5 >> 0x20)
                         );
      if (in_EDX < 0) {
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,p3),(int)((ulong)uVar5 >> 0x20)
                          ,(int)uVar5,0);
      }
      pcVar4 = (char *)CONCAT44((int)((ulong)uVar5 >> 0x20),0xfffffff8);
      sqlite3VdbeAddOp4(p,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                        in_stack_ffffffffffffff74,p3,pcVar4,in_stack_ffffffffffffff90);
      uVar2 = 0;
      if (-1 < in_EDX) {
        uVar2 = 0x10;
      }
      sqlite3VdbeChangeP5(p_01,uVar2 | 1);
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,p3),(int)((ulong)pcVar4 >> 0x20),
                        (int)pcVar4,0);
      if (*(char *)(in_RSI + 0x62) == '\0') {
        sqlite3MayAbort(in_RDI);
        sqlite3VdbeCurrentAddr(p_01);
      }
      else {
        sqlite3VdbeGoto((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,p3),(int)((ulong)pcVar4 >> 0x20))
        ;
        sqlite3VdbeCurrentAddr(p_01);
        sqlite3VdbeAddOp4Int
                  ((Vdbe *)CONCAT44(iCur,iDb_00),(int)((ulong)p >> 0x20),(int)p,
                   in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
        sqlite3UniqueConstraint((Parse *)db_00,code,(Index *)CONCAT44(iCur,iDb_00));
        sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,p3),
                            (int)((ulong)pcVar4 >> 0x20));
      }
      sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iCur,iDb_00),(int)((ulong)p >> 0x20),(int)p,
                        in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      if ((*(ushort *)(in_RSI + 99) >> 10 & 1) == 0) {
        sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,p3),
                          (int)((ulong)pcVar4 >> 0x20),(int)pcVar4);
      }
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,p3),(int)((ulong)pcVar4 >> 0x20),
                        (int)pcVar4,0);
      sqlite3VdbeChangeP5(p_01,0x10);
      sqlite3ReleaseTempReg(in_RDI,iReg);
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,p3),(int)((ulong)pcVar4 >> 0x20),
                        (int)pcVar4,0);
      sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,p3),
                          (int)((ulong)pcVar4 >> 0x20));
      sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,p3),(int)((ulong)pcVar4 >> 0x20),
                        (int)pcVar4);
      sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,p3),(int)((ulong)pcVar4 >> 0x20),
                        (int)pcVar4);
      sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,p3),(int)((ulong)pcVar4 >> 0x20),
                        (int)pcVar4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void sqlite3RefillIndex(Parse *pParse, Index *pIndex, int memRootPage){
  Table *pTab = pIndex->pTable;  /* The table that is indexed */
  int iTab = pParse->nTab++;     /* Btree cursor used for pTab */
  int iIdx = pParse->nTab++;     /* Btree cursor used for pIndex */
  int iSorter;                   /* Cursor opened by OpenSorter (if in use) */
  int addr1;                     /* Address of top of loop */
  int addr2;                     /* Address to jump to for next iteration */
  Pgno tnum;                     /* Root page of index */
  int iPartIdxLabel;             /* Jump to this label to skip a row */
  Vdbe *v;                       /* Generate code into this virtual machine */
  KeyInfo *pKey;                 /* KeyInfo for index */
  int regRecord;                 /* Register holding assembled index record */
  sqlite3 *db = pParse->db;      /* The database connection */
  int iDb = sqlite3SchemaToIndex(db, pIndex->pSchema);

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( sqlite3AuthCheck(pParse, SQLITE_REINDEX, pIndex->zName, 0,
      db->aDb[iDb].zDbSName ) ){
    return;
  }
#endif

  /* Require a write-lock on the table to perform this operation */
  sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);

  v = sqlite3GetVdbe(pParse);
  if( v==0 ) return;
  if( memRootPage>=0 ){
    tnum = (Pgno)memRootPage;
  }else{
    tnum = pIndex->tnum;
  }
  pKey = sqlite3KeyInfoOfIndex(pParse, pIndex);
  assert( pKey!=0 || pParse->nErr );

  /* Open the sorter cursor if we are to use one. */
  iSorter = pParse->nTab++;
  sqlite3VdbeAddOp4(v, OP_SorterOpen, iSorter, 0, pIndex->nKeyCol, (char*)
                    sqlite3KeyInfoRef(pKey), P4_KEYINFO);

  /* Open the table. Loop through all rows of the table, inserting index
  ** records into the sorter. */
  sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
  addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iTab, 0); VdbeCoverage(v);
  regRecord = sqlite3GetTempReg(pParse);
  sqlite3MultiWrite(pParse);

  sqlite3GenerateIndexKey(pParse,pIndex,iTab,regRecord,0,&iPartIdxLabel,0,0);
  sqlite3VdbeAddOp2(v, OP_SorterInsert, iSorter, regRecord);
  sqlite3ResolvePartIdxLabel(pParse, iPartIdxLabel);
  sqlite3VdbeAddOp2(v, OP_Next, iTab, addr1+1); VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr1);
  if( memRootPage<0 ) sqlite3VdbeAddOp2(v, OP_Clear, tnum, iDb);
  sqlite3VdbeAddOp4(v, OP_OpenWrite, iIdx, (int)tnum, iDb,
                    (char *)pKey, P4_KEYINFO);
  sqlite3VdbeChangeP5(v, OPFLAG_BULKCSR|((memRootPage>=0)?OPFLAG_P2ISREG:0));

  addr1 = sqlite3VdbeAddOp2(v, OP_SorterSort, iSorter, 0); VdbeCoverage(v);
  if( IsUniqueIndex(pIndex) ){
    int j2 = sqlite3VdbeGoto(v, 1);
    addr2 = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeVerifyAbortable(v, OE_Abort);
    sqlite3VdbeAddOp4Int(v, OP_SorterCompare, iSorter, j2, regRecord,
                         pIndex->nKeyCol); VdbeCoverage(v);
    sqlite3UniqueConstraint(pParse, OE_Abort, pIndex);
    sqlite3VdbeJumpHere(v, j2);
  }else{
    /* Most CREATE INDEX and REINDEX statements that are not UNIQUE can not
    ** abort. The exception is if one of the indexed expressions contains a
    ** user function that throws an exception when it is evaluated. But the
    ** overhead of adding a statement journal to a CREATE INDEX statement is
    ** very small (since most of the pages written do not contain content that
    ** needs to be restored if the statement aborts), so we call
    ** sqlite3MayAbort() for all CREATE INDEX statements.  */
    sqlite3MayAbort(pParse);
    addr2 = sqlite3VdbeCurrentAddr(v);
  }
  sqlite3VdbeAddOp3(v, OP_SorterData, iSorter, regRecord, iIdx);
  if( !pIndex->bAscKeyBug ){
    /* This OP_SeekEnd opcode makes index insert for a REINDEX go much
    ** faster by avoiding unnecessary seeks.  But the optimization does
    ** not work for UNIQUE constraint indexes on WITHOUT ROWID tables
    ** with DESC primary keys, since those indexes have there keys in
    ** a different order from the main table.
    ** See ticket: https://www.sqlite.org/src/info/bba7b69f9849b5bf
    */
    sqlite3VdbeAddOp1(v, OP_SeekEnd, iIdx);
  }
  sqlite3VdbeAddOp2(v, OP_IdxInsert, iIdx, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  sqlite3ReleaseTempReg(pParse, regRecord);
  sqlite3VdbeAddOp2(v, OP_SorterNext, iSorter, addr2); VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr1);

  sqlite3VdbeAddOp1(v, OP_Close, iTab);
  sqlite3VdbeAddOp1(v, OP_Close, iIdx);
  sqlite3VdbeAddOp1(v, OP_Close, iSorter);
}